

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O0

void __thiscall Network::update_triangles(Network *this,uint node_i,uint node_j,bool added)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference puVar6;
  size_type sVar7;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __result;
  reference puVar8;
  size_type sVar9;
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  iterator iStack_d8;
  uint node_k_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_2;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> intersection;
  iterator iStack_60;
  uint node_k_1;
  iterator __end1_1;
  iterator __begin1_1;
  value_type *__range1_1;
  uint removed_triangles_j;
  uint node_k;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  uint removed_triangles_i;
  int sign;
  bool added_local;
  uint node_j_local;
  uint node_i_local;
  Network *this_local;
  
  iVar2 = (uint)added * 2 + -1;
  __range1._4_4_ = 0;
  pvVar4 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::operator[](&this->links,(ulong)node_i);
  __end1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     (pvVar4);
  _removed_triangles_j =
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end(pvVar4);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&removed_triangles_j);
    if (!bVar1) break;
    puVar6 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end1);
    __range1_1._4_4_ = *puVar6;
    if (__range1_1._4_4_ != node_j) {
      pvVar4 = std::
               vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->links,(ulong)node_j);
      sVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        (pvVar4,(key_type *)((long)&__range1_1 + 4));
      if (sVar7 != 0) {
        __range1._4_4_ = __range1._4_4_ + 1;
      }
    }
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end1);
  }
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->triangle_count,(ulong)node_i);
  *pvVar5 = iVar2 * __range1._4_4_ + *pvVar5;
  this->total_triangles = iVar2 * __range1._4_4_ + this->total_triangles;
  __range1_1._0_4_ = 0;
  pvVar4 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::operator[](&this->links,(ulong)node_j);
  __end1_1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (pvVar4);
  iStack_60 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (pvVar4);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,&stack0xffffffffffffffa0);
    if (!bVar1) break;
    puVar6 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end1_1);
    intersection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = *puVar6;
    if (intersection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != node_i) {
      pvVar4 = std::
               vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->links,(ulong)node_i);
      sVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        (pvVar4,(key_type *)
                                ((long)&intersection.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (sVar7 != 0) {
        __range1_1._0_4_ = (int)__range1_1 + 1;
      }
    }
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end1_1);
  }
  iVar3 = iVar2 * (int)__range1_1;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->triangle_count,(ulong)node_j);
  *pvVar5 = *pvVar5 + iVar3;
  this->total_triangles = this->total_triangles + iVar2 * (int)__range1_1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  this_00 = &this->links;
  pvVar4 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::operator[](this_00,(ulong)node_i);
  __first1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (pvVar4);
  pvVar4 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::operator[](this_00,(ulong)node_i);
  __last1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      (pvVar4);
  pvVar4 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::operator[](this_00,(ulong)node_j);
  __first2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (pvVar4);
  pvVar4 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::operator[](this_00,(ulong)node_j);
  __last2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      (pvVar4);
  __result = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  std::
  set_intersection<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((_Rb_tree_const_iterator<unsigned_int>)__first1._M_node,
             (_Rb_tree_const_iterator<unsigned_int>)__last1._M_node,
             (_Rb_tree_const_iterator<unsigned_int>)__first2._M_node,
             (_Rb_tree_const_iterator<unsigned_int>)__last2._M_node,__result);
  __end1_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  iStack_d8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_2,&stack0xffffffffffffff28);
    if (!bVar1) break;
    puVar8 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1_2);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->triangle_count,(ulong)*puVar8);
    *pvVar5 = iVar2 + *pvVar5;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1_2);
  }
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  this->total_triangles = this->total_triangles + iVar2 * (int)sVar9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  return;
}

Assistant:

void update_triangles(unsigned int node_i, unsigned int node_j, bool added) {
        int sign = 2*added - 1;

        // update triangles in node_i
        unsigned int removed_triangles_i = 0;
        for (unsigned int node_k : links[node_i])
            if (node_k != node_j and links[node_j].count(node_k))
                removed_triangles_i++;
        triangle_count[node_i] += sign*removed_triangles_i;
        total_triangles += sign*removed_triangles_i;

        // update triangles in node_j
        unsigned int removed_triangles_j = 0;
        for (unsigned int node_k : links[node_j])
            if (node_k != node_i and links[node_i].count(node_k))
                removed_triangles_j++;
        triangle_count[node_j] += sign*removed_triangles_j;
        total_triangles += sign*removed_triangles_j;

        // update triangles in the other nodes.
        std::vector<unsigned int> intersection;
        std::set_intersection(links[node_i].begin(),
                              links[node_i].end(),
                              links[node_j].begin(),
                              links[node_j].end(),
                              std::back_inserter(intersection));

        for (unsigned int node_k : intersection)
            triangle_count[node_k] += sign*1;
        total_triangles += sign*intersection.size();
    }